

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O3

void __thiscall DFrameBuffer::DrawRateStuff(DFrameBuffer *this)

{
  BYTE *pBVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  int iVar12;
  uint32 uVar13;
  long lVar14;
  int iVar15;
  undefined8 uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int iVar41;
  undefined1 auVar40 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar44 [16];
  char fpsbuff [40];
  
  if (vid_fps.Value) {
    uVar10 = I_FPSTime();
    uVar21 = uVar10 - this->LastMS;
    if (-1 < (int)uVar21) {
      iVar11 = active_con_scale();
      if (iVar11 == 0) {
        iVar11 = CleanXfac;
      }
      mysnprintf(fpsbuff,0x28,"%2u ms (%3u fps)",(ulong)uVar21,(ulong)this->LastCount);
      iVar15 = (this->super_DSimpleCanvas).super_DCanvas.Width;
      iVar12 = FFont::StringWidth(ConFont,(BYTE *)fpsbuff);
      iVar12 = iVar15 / iVar11 - iVar12;
      (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (this,(ulong)(uint)(iVar12 * iVar11),0,
                 (ulong)(uint)(this->super_DSimpleCanvas).super_DCanvas.Width,
                 (ulong)(uint)(ConFont->FontHeight * iVar11),(ulong)GPalette.BlackIndex,0);
      if (iVar11 == 1) {
        DCanvas::DrawText((DCanvas *)this,ConFont,9,iVar12,0,fpsbuff,0);
      }
      else {
        DCanvas::DrawText((DCanvas *)this,ConFont,9,iVar12,0,fpsbuff,0x40001399,
                          (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar11 &
                          0xffffffff,0x4000139a,
                          (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar11 &
                          0xffffffff,0x400013a8,1,0);
      }
      uVar21 = uVar10 / 1000;
      uVar17 = uVar21 - this->LastSec;
      if (uVar21 < this->LastSec || uVar17 == 0) {
        uVar13 = this->FrameCount + 1;
      }
      else {
        this->LastCount = this->FrameCount / uVar17;
        this->LastSec = uVar21;
        this->FrameCount = 0;
        uVar13 = 1;
      }
      this->FrameCount = uVar13;
    }
    this->LastMS = uVar10;
  }
  if (ticker.Value == true) {
    uVar13 = (*I_GetTime)(false);
    iVar15 = uVar13 - this->LastTic;
    pBVar1 = (this->super_DSimpleCanvas).super_DCanvas.Buffer;
    this->LastTic = uVar13;
    iVar11 = 0x14;
    if (iVar15 < 0x14) {
      iVar11 = iVar15;
    }
    if (pBVar1 == (BYTE *)0x0) {
      uVar10 = 0;
      if (0 < iVar15) {
        uVar10 = 0xfffffffe;
        do {
          uVar17 = uVar10;
          uVar10 = uVar17 + 2;
          uVar21 = (this->super_DSimpleCanvas).super_DCanvas.Height;
          (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                    (this,(ulong)uVar10,(ulong)(uVar21 - 1),(ulong)(uVar17 + 3),(ulong)uVar21,0xff,0
                    );
        } while (SBORROW4(uVar17 + 4,iVar11 * 2) != (int)(uVar17 + 4 + iVar11 * -2) < 0);
        if (0x25 < uVar10) goto LAB_005add1d;
        uVar10 = uVar17 + 4;
      }
      do {
        uVar21 = (this->super_DSimpleCanvas).super_DCanvas.Height;
        (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (this,(ulong)uVar10,(ulong)(uVar21 - 1),(ulong)(uVar10 + 1),(ulong)uVar21,0,0);
        bVar22 = uVar10 < 0x26;
        uVar10 = uVar10 + 2;
      } while (bVar22);
    }
    else {
      lVar18 = (long)(((this->super_DSimpleCanvas).super_DCanvas.Height + -1) *
                     (this->super_DSimpleCanvas).super_DCanvas.Pitch);
      if (iVar15 < 1) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        do {
          uVar19 = uVar20;
          pBVar1[uVar19 + lVar18] = 0xff;
          uVar20 = uVar19 + 2;
        } while (uVar20 < (uint)(iVar11 * 2));
        if (0x25 < uVar19) goto LAB_005add1d;
      }
      auVar9 = _DAT_0073c1a0;
      auVar8 = _DAT_0073c190;
      auVar7 = _DAT_0073c180;
      auVar6 = _DAT_0073b300;
      auVar5 = _DAT_0073b2f0;
      lVar14 = 0;
      iVar11 = 0x26 - (int)uVar20;
      if (0x26 < uVar20) {
        iVar11 = 0;
      }
      uVar10 = iVar11 + 1U >> 1;
      auVar23._4_4_ = 0;
      auVar23._0_4_ = uVar10;
      auVar23._8_4_ = uVar10;
      auVar23._12_4_ = 0;
      lVar18 = lVar18 + uVar20;
      auVar23 = auVar23 | _DAT_0073b300;
      do {
        auVar34._8_4_ = (int)lVar14;
        auVar34._0_8_ = lVar14;
        auVar34._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar26 = (auVar34 | auVar5) ^ auVar6;
        iVar11 = auVar23._0_4_;
        iVar39 = -(uint)(iVar11 < auVar26._0_4_);
        iVar15 = auVar23._4_4_;
        auVar27._4_4_ = -(uint)(iVar15 < auVar26._4_4_);
        iVar12 = auVar23._8_4_;
        iVar41 = -(uint)(iVar12 < auVar26._8_4_);
        iVar24 = auVar23._12_4_;
        auVar27._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
        auVar36._4_4_ = iVar39;
        auVar36._0_4_ = iVar39;
        auVar36._8_4_ = iVar41;
        auVar36._12_4_ = iVar41;
        auVar42 = pshuflw(in_XMM11,auVar36,0xe8);
        auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar15);
        auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
        auVar29._0_4_ = auVar29._4_4_;
        auVar29._8_4_ = auVar29._12_4_;
        auVar44 = pshuflw(in_XMM12,auVar29,0xe8);
        auVar27._0_4_ = auVar27._4_4_;
        auVar27._8_4_ = auVar27._12_4_;
        auVar43 = pshuflw(auVar42,auVar27,0xe8);
        auVar26._8_4_ = 0xffffffff;
        auVar26._0_8_ = 0xffffffffffffffff;
        auVar26._12_4_ = 0xffffffff;
        auVar26 = (auVar43 | auVar44 & auVar42) ^ auVar26;
        auVar26 = packssdw(auVar26,auVar26);
        if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pBVar1[lVar14 * 2 + lVar18] = '\0';
        }
        auVar27 = auVar29 & auVar36 | auVar27;
        auVar26 = packssdw(auVar27,auVar27);
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar26 = packssdw(auVar26 ^ auVar43,auVar26 ^ auVar43);
        if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
          pBVar1[lVar14 * 2 + lVar18 + 2] = '\0';
        }
        auVar26 = (auVar34 | auVar9) ^ auVar6;
        iVar39 = -(uint)(iVar11 < auVar26._0_4_);
        auVar40._4_4_ = -(uint)(iVar15 < auVar26._4_4_);
        iVar41 = -(uint)(iVar12 < auVar26._8_4_);
        auVar40._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
        auVar28._4_4_ = iVar39;
        auVar28._0_4_ = iVar39;
        auVar28._8_4_ = iVar41;
        auVar28._12_4_ = iVar41;
        auVar35._4_4_ = -(uint)(auVar26._4_4_ == iVar15);
        auVar35._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar40._0_4_ = auVar40._4_4_;
        auVar40._8_4_ = auVar40._12_4_;
        auVar26 = auVar35 & auVar28 | auVar40;
        auVar26 = packssdw(auVar26,auVar26);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar26 = packssdw(auVar26 ^ auVar2,auVar26 ^ auVar2);
        if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pBVar1[lVar14 * 2 + lVar18 + 4] = '\0';
        }
        auVar29 = pshufhw(auVar28,auVar28,0x84);
        auVar36 = pshufhw(auVar35,auVar35,0x84);
        auVar27 = pshufhw(auVar29,auVar40,0x84);
        auVar30._8_4_ = 0xffffffff;
        auVar30._0_8_ = 0xffffffffffffffff;
        auVar30._12_4_ = 0xffffffff;
        auVar30 = (auVar27 | auVar36 & auVar29) ^ auVar30;
        auVar29 = packssdw(auVar30,auVar30);
        if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pBVar1[lVar14 * 2 + lVar18 + 6] = '\0';
        }
        auVar29 = (auVar34 | auVar8) ^ auVar6;
        iVar39 = -(uint)(iVar11 < auVar29._0_4_);
        auVar32._4_4_ = -(uint)(iVar15 < auVar29._4_4_);
        iVar41 = -(uint)(iVar12 < auVar29._8_4_);
        auVar32._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
        auVar37._4_4_ = iVar39;
        auVar37._0_4_ = iVar39;
        auVar37._8_4_ = iVar41;
        auVar37._12_4_ = iVar41;
        auVar26 = pshuflw(auVar26,auVar37,0xe8);
        auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar15);
        auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
        auVar31._0_4_ = auVar31._4_4_;
        auVar31._8_4_ = auVar31._12_4_;
        in_XMM12 = pshuflw(auVar44 & auVar42,auVar31,0xe8);
        in_XMM12 = in_XMM12 & auVar26;
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        auVar26 = pshuflw(auVar26,auVar32,0xe8);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar42 = (auVar26 | in_XMM12) ^ auVar42;
        in_XMM11 = packssdw(auVar42,auVar42);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pBVar1[lVar14 * 2 + lVar18 + 8] = '\0';
        }
        auVar32 = auVar31 & auVar37 | auVar32;
        auVar26 = packssdw(auVar32,auVar32);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar26 = packssdw(auVar26 ^ auVar44,auVar26 ^ auVar44);
        if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pBVar1[lVar14 * 2 + lVar18 + 10] = '\0';
        }
        auVar26 = (auVar34 | auVar7) ^ auVar6;
        iVar11 = -(uint)(iVar11 < auVar26._0_4_);
        auVar38._4_4_ = -(uint)(iVar15 < auVar26._4_4_);
        iVar12 = -(uint)(iVar12 < auVar26._8_4_);
        auVar38._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
        auVar33._4_4_ = iVar11;
        auVar33._0_4_ = iVar11;
        auVar33._8_4_ = iVar12;
        auVar33._12_4_ = iVar12;
        auVar25._4_4_ = -(uint)(auVar26._4_4_ == iVar15);
        auVar25._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
        auVar25._0_4_ = auVar25._4_4_;
        auVar25._8_4_ = auVar25._12_4_;
        auVar38._0_4_ = auVar38._4_4_;
        auVar38._8_4_ = auVar38._12_4_;
        auVar26 = auVar25 & auVar33 | auVar38;
        auVar26 = packssdw(auVar26,auVar26);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar26 = packssdw(auVar26 ^ auVar3,auVar26 ^ auVar3);
        if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pBVar1[lVar14 * 2 + lVar18 + 0xc] = '\0';
        }
        auVar34 = pshufhw(auVar33,auVar33,0x84);
        auVar26 = pshufhw(auVar25,auVar25,0x84);
        auVar29 = pshufhw(auVar34,auVar38,0x84);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar26 = packssdw(auVar26 & auVar34,(auVar29 | auVar26 & auVar34) ^ auVar4);
        if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pBVar1[lVar14 * 2 + lVar18 + 0xe] = '\0';
        }
        lVar14 = lVar14 + 8;
      } while ((ulong)(uVar10 & 0x38) + 8 != lVar14);
    }
  }
LAB_005add1d:
  if (vid_showpalette.Value != 0) {
    if ((DrawRateStuff()::palette == '\0') &&
       (iVar11 = __cxa_guard_acquire(&DrawRateStuff()::palette), iVar11 != 0)) {
      FPaletteTester::FPaletteTester(&DrawRateStuff::palette);
      __cxa_atexit(FTexture::~FTexture,&DrawRateStuff::palette,&__dso_handle);
      __cxa_guard_release(&DrawRateStuff()::palette);
    }
    uVar16 = 0xe0;
    if ((screen->super_DSimpleCanvas).super_DCanvas.Height < 800) {
      uVar16 = 0x70;
    }
    if (vid_showpalette.Value - 1U < 9) {
      DrawRateStuff::palette.WantTranslation = vid_showpalette.Value;
    }
    DCanvas::DrawTexture
              ((DCanvas *)this,&DrawRateStuff::palette.super_FTexture,0.0,0.0,0x40001389,uVar16,
               0x4000138a,uVar16,0x400013a5,0,0);
  }
  return;
}

Assistant:

void DFrameBuffer::DrawRateStuff ()
{
	// Draws frame time and cumulative fps
	if (vid_fps)
	{
		DWORD ms = I_FPSTime();
		DWORD howlong = ms - LastMS;
		if ((signed)howlong >= 0)
		{
			char fpsbuff[40];
			int chars;
			int rate_x;

			int textScale = active_con_scale();
			if (textScale == 0)
				textScale = CleanXfac;

			chars = mysnprintf (fpsbuff, countof(fpsbuff), "%2u ms (%3u fps)", howlong, LastCount);
			rate_x = Width / textScale - ConFont->StringWidth(&fpsbuff[0]);
			Clear (rate_x * textScale, 0, Width, ConFont->GetHeight() * textScale, GPalette.BlackIndex, 0);
			if (textScale == 1)
				DrawText (ConFont, CR_WHITE, rate_x, 0, (char *)&fpsbuff[0], TAG_DONE);
			else
				DrawText (ConFont, CR_WHITE, rate_x, 0, (char *)&fpsbuff[0],
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			DWORD thisSec = ms/1000;
			if (LastSec < thisSec)
			{
				LastCount = FrameCount / (thisSec - LastSec);
				LastSec = thisSec;
				FrameCount = 0;
			}
			FrameCount++;
		}
		LastMS = ms;
	}

	// draws little dots on the bottom of the screen
	if (ticker)
	{
		int i = I_GetTime(false);
		int tics = i - LastTic;
		BYTE *buffer = GetBuffer();

		LastTic = i;
		if (tics > 20) tics = 20;

		// Buffer can be NULL if we're doing hardware accelerated 2D
		if (buffer != NULL)
		{
			buffer += (GetHeight()-1) * GetPitch();
			
			for (i = 0; i < tics*2; i += 2)		buffer[i] = 0xff;
			for ( ; i < 20*2; i += 2)			buffer[i] = 0x00;
		}
		else
		{
			for (i = 0; i < tics*2; i += 2)		Clear(i, Height-1, i+1, Height, 255, 0);
			for ( ; i < 20*2; i += 2)			Clear(i, Height-1, i+1, Height, 0, 0);
		}
	}

	// draws the palette for debugging
	if (vid_showpalette)
	{
		// This used to just write the palette to the display buffer.
		// With hardware-accelerated 2D, that doesn't work anymore.
		// Drawing it as a texture does and continues to show how
		// well the PalTex shader is working.
		static FPaletteTester palette;
		int size = screen->GetHeight() < 800 ? 16 * 7 : 16 * 7 * 2;

		palette.SetTranslation(vid_showpalette);
		DrawTexture(&palette, 0, 0,
			DTA_DestWidth, size,
			DTA_DestHeight, size,
			DTA_Masked, false,
			TAG_DONE);
	}
}